

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

bool __thiscall
jsonnet::internal::SortImports::duplicatedVariables(SortImports *this,ImportElems *elems)

{
  pointer pIVar1;
  ImportElems *__range2;
  ImportElem *elem;
  pointer pIVar2;
  bool bVar3;
  set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  idents;
  _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::_Identity<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  local_50;
  
  local_50._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_50._M_impl.super__Rb_tree_header._M_header;
  local_50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
  pIVar2 = (elems->
           super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (elems->
           super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_50._M_impl.super__Rb_tree_header._M_header._M_right =
       local_50._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pIVar2 != pIVar1) {
    do {
      std::
      _Rb_tree<std::__cxx11::u32string,std::__cxx11::u32string,std::_Identity<std::__cxx11::u32string>,std::less<std::__cxx11::u32string>,std::allocator<std::__cxx11::u32string>>
      ::_M_insert_unique<std::__cxx11::u32string_const&>
                ((_Rb_tree<std::__cxx11::u32string,std::__cxx11::u32string,std::_Identity<std::__cxx11::u32string>,std::less<std::__cxx11::u32string>,std::allocator<std::__cxx11::u32string>>
                  *)&local_50,&((pIVar2->bind).var)->name);
      pIVar2 = pIVar2 + 1;
    } while (pIVar2 != pIVar1);
  }
  bVar3 = local_50._M_impl.super__Rb_tree_header._M_node_count <
          (ulong)(((long)(elems->
                         super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(elems->
                         super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x34f72c234f72c235);
  std::
  _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::_Identity<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ::~_Rb_tree(&local_50);
  return bVar3;
}

Assistant:

bool duplicatedVariables(const ImportElems &elems)
    {
        std::set<UString> idents;
        for (const auto &elem : elems) {
            idents.insert(elem.bind.var->name);
        }
        return idents.size() < elems.size();
    }